

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVJobServerClient.cxx
# Opt level: O1

optional<cmUVJobServerClient> __thiscall
cmUVJobServerClient::Connect
          (cmUVJobServerClient *this,uv_loop_t *loop,function<void_()> *onToken,
          function<void_(int)> *onDisconnect)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__n1;
  element_type *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  basic_string_view<char,_std::char_traits<char>_> *pbVar4;
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  cmUVJobServerClient this_01;
  undefined8 *puVar9;
  uv_stream_t *puVar10;
  uv_pipe_s *handle;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar11;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  pointer pbVar12;
  basic_string_view<char,_std::char_traits<char>_> *pbVar13;
  string_view str;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l;
  optional<cmUVJobServerClient> oVar14;
  basic_string_view<char,_std::char_traits<char>_> __str;
  uv_pipe_ptr connRead;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> auth;
  int reader;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  makeflags;
  undefined1 local_118 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  _Any_data local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  _Any_data local_b8;
  element_type *local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  _Storage<cmUVJobServerClient,_false> local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  ulong local_48;
  char *pcStack_40;
  
  this_01.Impl_._M_t.
  super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>.
  _M_t.
  super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
  .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl =
       (unique_ptr<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>)
       operator_new(0xb8);
  Impl::Impl((Impl *)this_01.Impl_._M_t.
                     super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
                     .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl,loop);
  *(undefined ***)
   this_01.Impl_._M_t.
   super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
   ._M_t.
   super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
   .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl =
       &PTR__ImplPosix_00bd8c38;
  *(undefined4 *)
   &((Impl *)((long)this_01.Impl_._M_t.
                    super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
                    .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl + 0x68))
    ->_vptr_Impl = 0;
  *(uv_loop_t **)
   ((long)this_01.Impl_._M_t.
          super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
          ._M_t.
          super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
          .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl + 0x70) =
       (uv_loop_t *)0x0;
  (((uv_idle_ptr *)
   ((long)this_01.Impl_._M_t.
          super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
          ._M_t.
          super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
          .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl + 0x78))->
  super_uv_handle_ptr_<uv_idle_s>).super_uv_handle_ptr_base_<uv_idle_s>.handle.
  super___shared_ptr<uv_idle_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
  ((long)this_01.Impl_._M_t.
         super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
         ._M_t.
         super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
         .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl + 0x80))->_M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)
   &(((function<void_()> *)
     ((long)this_01.Impl_._M_t.
            super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
            ._M_t.
            super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
            .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl + 0x88))->
    super__Function_base)._M_functor = 0;
  *(undefined8 *)
   ((long)this_01.Impl_._M_t.
          super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
          ._M_t.
          super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
          .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl + 0x90) = 0;
  *(_Manager_type *)
   ((long)this_01.Impl_._M_t.
          super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
          ._M_t.
          super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
          .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl + 0x98) =
       (_Manager_type)0x0;
  *(_Invoker_type *)
   ((long)this_01.Impl_._M_t.
          super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
          ._M_t.
          super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
          .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl + 0xa0) =
       (_Invoker_type)0x0;
  puVar9 = (undefined8 *)operator_new(0x30);
  puVar9[1] = 0x100000001;
  *puVar9 = &PTR___Sp_counted_ptr_inplace_00bd7a10;
  puVar9[2] = 0;
  puVar9[3] = 0;
  puVar9[4] = 0;
  puVar9[5] = 0;
  ((__uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_> *)
  (puVar9 + 2))->_M_t =
       (tuple<cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>)
       this_01.Impl_._M_t.
       super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
       .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl;
  puVar9[5] = std::
              _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmUVJobServerClient.cxx:204:56)>
              ::_M_invoke;
  puVar9[4] = std::
              _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmUVJobServerClient.cxx:204:56)>
              ::_M_manager;
  *(undefined8 **)
   &(((function<void_(int)> *)
     ((long)this_01.Impl_._M_t.
            super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
            ._M_t.
            super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
            .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl + 0xa8))->
    super__Function_base)._M_functor = puVar9;
  *(undefined8 **)
   ((long)this_01.Impl_._M_t.
          super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
          ._M_t.
          super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
          .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl + 0xa0) =
       puVar9 + 2;
  *(undefined2 *)
   ((long)this_01.Impl_._M_t.
          super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
          ._M_t.
          super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
          .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl + 0xb0) = 0x2e;
  if (((anonymous_namespace)::ImplPosix::Connect()::prefixes == '\0') &&
     (iVar7 = __cxa_guard_acquire(&(anonymous_namespace)::ImplPosix::Connect()::prefixes),
     iVar7 != 0)) {
    local_48 = 2;
    pcStack_40 = "-J";
    local_58._0_8_ = 0x10;
    local_58._8_8_ =
         (long)"MAKEFLAGS=--flags-before --jobserver-auth=bogus --flags-between --jobserver-fds=" +
         0x40;
    local_68._0_8_ = &DAT_00000011;
    local_68._8_8_ = "--jobserver-auth=";
    __l._M_len = 3;
    __l._M_array = (iterator)local_68;
    local_118._24_8_ =
         this_01.Impl_._M_t.
         super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
         ._M_t.
         super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
         .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl;
    std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::vector((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)&(anonymous_namespace)::ImplPosix::Connect()::prefixes,__l,
             (allocator_type *)local_d8._M_pod_data);
    __cxa_atexit(std::
                 vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ::~vector,&(anonymous_namespace)::ImplPosix::Connect()::prefixes,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::ImplPosix::Connect()::prefixes);
    this_01.Impl_._M_t.
    super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
    ._M_t.
    super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
    .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl =
         (unique_ptr<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>)
         (unique_ptr<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>)
         local_118._24_8_;
  }
  local_c8._M_allocated_capacity = 0x47414c46454b414d;
  local_c8._8_2_ = 0x53;
  local_d8._8_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x9;
  local_d8._M_unused._M_object = &local_c8;
  cmSystemTools::GetEnvVar
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_68,(string *)&local_d8);
  uVar11 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_unused._0_8_ != &local_c8) {
    operator_delete(local_d8._M_unused._M_object,(ulong)(local_c8._M_allocated_capacity + 1));
    uVar11 = extraout_RDX_00;
  }
  if (local_48._0_1_ != false) {
    local_b8._M_pod_data[0] = '\0';
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_118._24_8_ =
         this_01.Impl_._M_t.
         super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
         ._M_t.
         super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
         .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl;
    cmSystemTools::ParseUnixCommandLine((char *)local_68._0_8_,&local_88);
    local_90._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_88.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    pbVar12 = local_88.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    local_a8 = (element_type *)onToken;
    local_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)onDisconnect;
    local_98 = (_Storage<cmUVJobServerClient,_false>)this;
    do {
      pbVar4 = DAT_00bff9a0;
      if (pbVar12 == (pointer)local_90._M_pi) break;
      if ((anonymous_namespace)::ImplPosix::Connect()::prefixes != DAT_00bff9a0) {
        paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)pbVar12 + -0x20))->
                    _vptr__Sp_counted_base;
        paVar2 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   **)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)pbVar12 + -0x20))->
                       _M_use_count;
        pbVar13 = (anonymous_namespace)::ImplPosix::Connect()::prefixes;
        do {
          __n1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)pbVar13->_M_len;
          local_118._32_8_ = paVar2;
          local_118._40_8_ = paVar1;
          iVar7 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                            ((basic_string_view<char,_std::char_traits<char>_> *)(local_118 + 0x20),
                             0,(size_type)__n1,*pbVar13);
          if (iVar7 == 0) {
            str._M_len = (long)paVar2 - (long)__n1;
            if (paVar2 < __n1) {
              std::__throw_out_of_range_fmt
                        ("%s: __pos (which is %zu) > __size (which is %zu)",
                         "basic_string_view::substr",__n1,paVar2);
            }
            str._M_str = (char *)((long)__n1 + (long)paVar1);
            cmTrimWhitespace_abi_cxx11_((string *)(local_118 + 0x20),str);
            std::optional<std::__cxx11::string>::operator=
                      ((optional<std::__cxx11::string> *)local_d8._M_pod_data,
                       (string *)(local_118 + 0x20));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._32_8_ != &local_e8) {
              operator_delete((void *)local_118._32_8_,(ulong)(local_e8._M_allocated_capacity + 1));
            }
            break;
          }
          pbVar13 = pbVar13 + 1;
        } while (pbVar13 != pbVar4);
      }
      pbVar12 = (pointer)((long)pbVar12 + -0x20);
    } while (local_b8._M_pod_data[0] != '\x01');
    this = (cmUVJobServerClient *)local_98;
    onDisconnect = (function<void_(int)> *)local_a0._M_pi;
    onToken = (function<void_()> *)local_a8;
    this_01.Impl_._M_t.
    super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
    ._M_t.
    super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
    .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl =
         (unique_ptr<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>)
         (unique_ptr<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>)
         local_118._24_8_;
    if (local_b8._M_pod_data[0] == '\x01') {
      local_118._32_8_ = local_d8._8_8_;
      local_118._40_8_ = local_d8._M_unused._M_object;
      __str._M_str = "fifo:";
      __str._M_len = 5;
      iVar7 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                        ((basic_string_view<char,_std::char_traits<char>_> *)(local_118 + 0x20),0,5,
                         __str);
      if (iVar7 == 0) {
        std::__cxx11::string::substr((ulong)(local_118 + 0x20),(ulong)&local_d8);
        iVar7 = open((char *)local_118._32_8_,2);
        if (-1 < iVar7) {
          local_118._0_8_ = (element_type *)0x0;
          local_118._8_8_ = (uv_loop_t *)0x0;
          ::cm::uv_pipe_ptr::init
                    ((uv_pipe_ptr *)local_118,
                     (EVP_PKEY_CTX *)
                     *(uv_loop_t **)
                      ((long)this_01.Impl_._M_t.
                             super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
                             .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl
                      + 8));
          handle = ::cm::uv_handle_ptr_::operator_cast_to_uv_pipe_s_
                             ((uv_handle_ptr_<uv_pipe_s> *)local_118);
          iVar8 = uv_pipe_open(handle,iVar7);
          if (iVar8 == 0) {
            bVar6 = ::cm::uv_handle_ptr_base_::operator_cast_to_bool
                              ((uv_handle_ptr_base_<uv_pipe_s> *)local_118);
            if (bVar6) {
              puVar10 = ::cm::uv_pipe_ptr::operator_cast_to_uv_stream_s_((uv_pipe_ptr *)local_118);
              iVar7 = uv_is_readable(puVar10);
              if (iVar7 != 0) {
                puVar10 = ::cm::uv_pipe_ptr::operator_cast_to_uv_stream_s_((uv_pipe_ptr *)local_118)
                ;
                iVar7 = uv_is_writable(puVar10);
                uVar5 = local_118._8_8_;
                uVar11 = local_118._0_8_;
                if (iVar7 != 0) {
                  local_118._0_8_ = (element_type *)0x0;
                  local_118._8_8_ = (uv_loop_t *)0x0;
                  p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           (((Impl *)((long)this_01.Impl_._M_t.
                                            super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
                                            .
                                            super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>
                                            ._M_head_impl + 0x68))->OnToken).super__Function_base.
                           _M_manager;
                  *(undefined8 *)
                   ((long)&(((Impl *)((long)this_01.Impl_._M_t.
                                            super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
                                            .
                                            super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>
                                            ._M_head_impl + 0x68))->OnToken).super__Function_base.
                           _M_functor + 8) = uVar11;
                  (((Impl *)((long)this_01.Impl_._M_t.
                                   super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
                                   .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>.
                                   _M_head_impl + 0x68))->OnToken).super__Function_base._M_manager =
                       (_Manager_type)uVar5;
                  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
                  }
                  *(undefined4 *)
                   &((Impl *)((long)this_01.Impl_._M_t.
                                    super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
                                    .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>.
                                    _M_head_impl + 0x68))->_vptr_Impl = 2;
                }
              }
            }
          }
          else {
            close(iVar7);
          }
          ::cm::uv_handle_ptr_base_<uv_pipe_s>::~uv_handle_ptr_base_
                    ((uv_handle_ptr_base_<uv_pipe_s> *)local_118);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._32_8_ != &local_e8) {
          operator_delete((void *)local_118._32_8_,(ulong)(local_e8._M_allocated_capacity + 1));
        }
      }
      else {
        iVar7 = __isoc99_sscanf(local_d8._M_unused._M_object,"%d,%d",local_b8._M_pod_data + 0xc,
                                local_b8._M_pod_data + 8);
        if (iVar7 == 2) {
          anon_unknown.dwarf_4a6a61::ImplPosix::OpenFD
                    ((ImplPosix *)(local_118 + 0x20),
                     (int)this_01.Impl_._M_t.
                          super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
                          .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl);
          anon_unknown.dwarf_4a6a61::ImplPosix::OpenFD
                    ((ImplPosix *)local_118,
                     (int)this_01.Impl_._M_t.
                          super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
                          .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl);
          bVar6 = ::cm::uv_handle_ptr_base_::operator_cast_to_bool
                            ((uv_handle_ptr_base_<uv_pipe_s> *)(local_118 + 0x20));
          if (bVar6) {
            puVar10 = ::cm::uv_pipe_ptr::operator_cast_to_uv_stream_s_
                                ((uv_pipe_ptr *)(local_118 + 0x20));
            iVar7 = uv_is_readable(puVar10);
            if ((iVar7 != 0) &&
               (bVar6 = ::cm::uv_handle_ptr_base_::operator_cast_to_bool
                                  ((uv_handle_ptr_base_<uv_pipe_s> *)local_118), bVar6)) {
              puVar10 = ::cm::uv_pipe_ptr::operator_cast_to_uv_stream_s_((uv_pipe_ptr *)local_118);
              iVar7 = uv_is_writable(puVar10);
              uVar5 = local_118._40_8_;
              uVar11 = local_118._32_8_;
              if (iVar7 != 0) {
                local_118._32_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
                local_118._40_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
                this_00 = (((Impl *)((long)this_01.Impl_._M_t.
                                           super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
                                           .
                                           super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>
                                           ._M_head_impl + 0x68))->ImplicitToken).
                          super_uv_handle_ptr_<uv_idle_s>.super_uv_handle_ptr_base_<uv_idle_s>.
                          handle.super___shared_ptr<uv_idle_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                ((Impl *)((long)this_01.Impl_._M_t.
                                super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
                                .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>.
                                _M_head_impl + 0x68))->Loop = (uv_loop_t *)uVar11;
                (((Impl *)((long)this_01.Impl_._M_t.
                                 super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
                                 .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>.
                                 _M_head_impl + 0x68))->ImplicitToken).
                super_uv_handle_ptr_<uv_idle_s>.super_uv_handle_ptr_base_<uv_idle_s>.handle.
                super___shared_ptr<uv_idle_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)uVar5;
                if (this_00 != (element_type *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
                }
                uVar5 = local_118._8_8_;
                uVar11 = local_118._0_8_;
                local_118._0_8_ = (element_type *)0x0;
                local_118._8_8_ = (uv_loop_t *)0x0;
                p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                          &(((Impl *)((long)this_01.Impl_._M_t.
                                            super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
                                            .
                                            super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>
                                            ._M_head_impl + 0x68))->OnToken).super__Function_base.
                           _M_functor;
                (((Impl *)((long)this_01.Impl_._M_t.
                                 super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
                                 .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>.
                                 _M_head_impl + 0x68))->ImplicitToken).
                super_uv_handle_ptr_<uv_idle_s>.super_uv_handle_ptr_base_<uv_idle_s>.handle.
                super___shared_ptr<uv_idle_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar11;
                *(undefined8 *)
                 &(((Impl *)((long)this_01.Impl_._M_t.
                                   super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
                                   .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>.
                                   _M_head_impl + 0x68))->OnToken).super__Function_base._M_functor =
                     uVar5;
                if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
                }
                *(undefined4 *)
                 &((Impl *)((long)this_01.Impl_._M_t.
                                  super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
                                  .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>.
                                  _M_head_impl + 0x68))->_vptr_Impl = 1;
              }
            }
          }
          ::cm::uv_handle_ptr_base_<uv_pipe_s>::~uv_handle_ptr_base_
                    ((uv_handle_ptr_base_<uv_pipe_s> *)local_118);
          ::cm::uv_handle_ptr_base_<uv_pipe_s>::~uv_handle_ptr_base_
                    ((uv_handle_ptr_base_<uv_pipe_s> *)(local_118 + 0x20));
        }
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_88);
    uVar11 = extraout_RDX_01;
    if ((local_b8._M_pod_data[0] == '\x01') &&
       (local_b8._M_pod_data[0] = '\0',
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)local_d8._M_unused._0_8_ != &local_c8)) {
      operator_delete(local_d8._M_unused._M_object,(ulong)(local_c8._M_allocated_capacity + 1));
      uVar11 = extraout_RDX_02;
    }
  }
  if ((local_48._0_1_ == true) &&
     (local_48 = local_48 & 0xffffffffffffff00, (undefined1 *)local_68._0_8_ != local_58)) {
    operator_delete((void *)local_68._0_8_,local_58._0_8_ + 1);
    uVar11 = extraout_RDX_03;
  }
  bVar6 = *(int *)&((Impl *)((long)this_01.Impl_._M_t.
                                   super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
                                   .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>.
                                   _M_head_impl + 0x68))->_vptr_Impl != 0;
  if (bVar6) {
    std::function<void_()>::operator=
              ((function<void_()> *)
               ((long)this_01.Impl_._M_t.
                      super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
                      .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl + 0x20
               ),onToken);
    std::function<void_(int)>::operator=
              ((function<void_(int)> *)
               ((long)this_01.Impl_._M_t.
                      super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
                      .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl + 0x40
               ),onDisconnect);
    *this = (cmUVJobServerClient)
            this_01.Impl_._M_t.
            super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
            ._M_t.
            super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
            .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl;
    this_01.Impl_._M_t.
    super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
    ._M_t.
    super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
    .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl =
         (unique_ptr<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>)
         (__uniq_ptr_data<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>,_true,_true>
          )0x0;
    uVar11 = extraout_RDX_04;
  }
  *(bool *)&(((cmUVJobServerClient *)((long)this + 8))->Impl_)._M_t.
            super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
            ._M_t.
            super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
            .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl = bVar6;
  if ((__uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>)
      this_01.Impl_._M_t.
      super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
      ._M_t.
      super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
      .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>)
      0x0) {
    (**(code **)(*(long *)this_01.Impl_._M_t.
                          super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
                          .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl +
                8))(this_01.Impl_._M_t.
                    super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
                    .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl);
    uVar11 = extraout_RDX_05;
  }
  oVar14.super__Optional_base<cmUVJobServerClient,_false,_false>._M_payload.
  super__Optional_payload<cmUVJobServerClient,_true,_false,_false>.
  super__Optional_payload_base<cmUVJobServerClient>._8_8_ = uVar11;
  oVar14.super__Optional_base<cmUVJobServerClient,_false,_false>._M_payload.
  super__Optional_payload<cmUVJobServerClient,_true,_false,_false>.
  super__Optional_payload_base<cmUVJobServerClient>._M_payload.field2 = this;
  return (optional<cmUVJobServerClient>)
         oVar14.super__Optional_base<cmUVJobServerClient,_false,_false>._M_payload.
         super__Optional_payload<cmUVJobServerClient,_true,_false,_false>.
         super__Optional_payload_base<cmUVJobServerClient>;
}

Assistant:

cm::optional<cmUVJobServerClient> cmUVJobServerClient::Connect(
  uv_loop_t& loop, std::function<void()> onToken,
  std::function<void(int)> onDisconnect)
{
#if defined(_WIN32)
  // FIXME: Windows job server client not yet implemented.
  static_cast<void>(loop);
  static_cast<void>(onToken);
  static_cast<void>(onDisconnect);
#else
  auto impl = cm::make_unique<ImplPosix>(loop);
  if (impl && impl->IsConnected()) {
    impl->OnToken = std::move(onToken);
    impl->OnDisconnect = std::move(onDisconnect);
    return cmUVJobServerClient(std::move(impl));
  }
#endif
  return cm::nullopt;
}